

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  int iVar1;
  TokenType TVar2;
  bool bVar3;
  __type _Var4;
  CppType CVar5;
  LogMessage *other;
  EnumDescriptor *this_00;
  EnumValueDescriptor *value_00;
  AlphaNum *a;
  byte bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *psVar7;
  float value_01;
  string local_140;
  string local_120;
  EnumDescriptor *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string value_4;
  int64 local_70;
  int64 int_value;
  int64 value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  CVar5 = FieldDescriptor::cpp_type(field);
  switch(CVar5) {
  case CPPTYPE_INT32:
    bVar3 = ConsumeSignedInteger(this,&int_value,0x7fffffff);
    if (!bVar3) {
LAB_003172a0:
      bVar6 = 0;
      goto LAB_003172a2;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt32(reflection,message,field,(uint32)int_value);
    }
    else {
      Reflection::SetInt32(reflection,message,field,(uint32)int_value);
    }
    break;
  case CPPTYPE_INT64:
    bVar3 = ConsumeSignedInteger(this,&int_value,0x7fffffffffffffff);
    if (!bVar3) goto LAB_003172a0;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(reflection,message,field,int_value);
    }
    else {
      Reflection::SetInt64(reflection,message,field,int_value);
    }
    break;
  case CPPTYPE_UINT32:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)&int_value,0xffffffff);
    if (!bVar3) goto LAB_003172a0;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt32(reflection,message,field,(uint32)int_value);
    }
    else {
      Reflection::SetUInt32(reflection,message,field,(uint32)int_value);
    }
    break;
  case CPPTYPE_UINT64:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)&int_value,0xffffffffffffffff);
    if (!bVar3) goto LAB_003172a0;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt64(reflection,message,field,int_value);
    }
    else {
      Reflection::SetUInt64(reflection,message,field,int_value);
    }
    break;
  case CPPTYPE_DOUBLE:
    bVar3 = ConsumeDouble(this,(double *)&int_value);
    if (!bVar3) goto LAB_003172a0;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddDouble(reflection,message,field,(double)int_value);
    }
    else {
      Reflection::SetDouble(reflection,message,field,(double)int_value);
    }
    break;
  case CPPTYPE_FLOAT:
    bVar3 = ConsumeDouble(this,(double *)&int_value);
    if (!bVar3) goto LAB_003172a0;
    iVar1 = *(int *)(field + 0x3c);
    value_01 = io::SafeDoubleToFloat((double)int_value);
    if (iVar1 == 3) {
      Reflection::AddFloat(reflection,message,field,value_01);
    }
    else {
      Reflection::SetFloat(reflection,message,field,value_01);
    }
    break;
  case CPPTYPE_BOOL:
    if ((this->tokenizer_).current_.type != TYPE_INTEGER) {
      int_value = (int64)local_58;
      value = 0;
      local_58[0]._M_local_buf[0] = '\0';
      bVar3 = ConsumeIdentifier(this,(string *)&int_value);
      if (!bVar3) {
LAB_00317297:
        std::__cxx11::string::~string((string *)&int_value);
        goto LAB_003172a0;
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &int_value,"true");
      if (((bVar3) ||
          (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&int_value,"True"), bVar3)) ||
         (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&int_value,"t"), bVar3)) {
        bVar3 = true;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&int_value,"false");
        if (((!bVar3) &&
            (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&int_value,"False"), !bVar3)) &&
           (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&int_value,"f"), !bVar3)) {
          std::operator+(&local_d8,"Invalid value for boolean field \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          std::operator+(&local_f8,&local_d8,"\". Value: \"");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&value_4.field_2 + 8),&local_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &int_value);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&value_4.field_2 + 8),"\".");
          ReportError(this,(string *)local_b8);
          std::__cxx11::string::~string((string *)local_b8);
          std::__cxx11::string::~string((string *)(value_4.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_d8);
          goto LAB_00317297;
        }
        bVar3 = false;
      }
      if (*(int *)(field + 0x3c) == 3) {
        Reflection::AddBool(reflection,message,field,bVar3);
      }
      else {
        Reflection::SetBool(reflection,message,field,bVar3);
      }
      goto LAB_00316ecf;
    }
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)&int_value,1);
    if (!bVar3) goto LAB_003172a0;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddBool(reflection,message,field,int_value != 0);
    }
    else {
      Reflection::SetBool(reflection,message,field,int_value != 0);
    }
    break;
  case CPPTYPE_ENUM:
    local_b8 = (undefined1  [8])&value_4._M_string_length;
    value_4._M_dataplus._M_p = (pointer)0x0;
    value_4._M_string_length._0_1_ = 0;
    local_70 = 0x7fffffffffffffff;
    this_00 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar3 = ConsumeIdentifier(this,(string *)local_b8);
      if (!bVar3) goto LAB_00317181;
      value_00 = EnumDescriptor::FindValueByName(this_00,(string *)local_b8);
LAB_00316f5b:
      if (value_00 == (EnumValueDescriptor *)0x0) {
        if ((local_70 == 0x7fffffffffffffff) ||
           (bVar3 = Reflection::SupportsUnknownEnumValues(reflection), !bVar3)) {
          if (this->allow_unknown_enum_ == false) {
            std::operator+(&local_d8,"Unknown enumeration value of \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8);
            std::operator+(&local_f8,&local_d8,"\" for field \"");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&value_4.field_2 + 8),&local_f8,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            field);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &int_value,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&value_4.field_2 + 8),"\".");
            ReportError(this,(string *)&int_value);
            std::__cxx11::string::~string((string *)&int_value);
            std::__cxx11::string::~string((string *)(value_4.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)&local_f8);
            this_01 = &local_d8;
            goto LAB_0031717c;
          }
          std::operator+(&local_d8,"Unknown enumeration value of \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_f8,&local_d8,"\" for field \"");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&value_4.field_2 + 8),&local_f8,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &int_value,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&value_4.field_2 + 8),"\".");
          ReportWarning(this,(string *)&int_value);
          std::__cxx11::string::~string((string *)&int_value);
          std::__cxx11::string::~string((string *)(value_4.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_d8);
          bVar3 = true;
          field = (FieldDescriptor *)0x1;
        }
        else {
          bVar3 = true;
          if (*(int *)(field + 0x3c) == 3) {
            Reflection::AddEnumValue(reflection,message,field,(int)local_70);
            field = (FieldDescriptor *)0x1;
          }
          else {
            Reflection::SetEnumValue(reflection,message,field,(int)local_70);
            field = (FieldDescriptor *)0x1;
          }
        }
      }
      else {
        if (*(int *)(field + 0x3c) == 3) {
          Reflection::AddEnum(reflection,message,field,value_00);
        }
        else {
          Reflection::SetEnum(reflection,message,field,value_00);
        }
        bVar3 = false;
      }
    }
    else {
      local_100 = this_00;
      std::__cxx11::string::string
                ((string *)&int_value,"-",(allocator *)(value_4.field_2._M_local_buf + 8));
      psVar7 = &(this->tokenizer_).current_.text;
      _Var4 = std::operator==(psVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&int_value);
      if (_Var4) {
        std::__cxx11::string::~string((string *)&int_value);
LAB_00316ef8:
        bVar3 = ConsumeSignedInteger(this,&local_70,0x7fffffff);
        if (bVar3) {
          strings::AlphaNum::AlphaNum((AlphaNum *)&int_value,local_70);
          StrCat_abi_cxx11_((string *)((long)&value_4.field_2 + 8),(protobuf *)&int_value,a);
          std::__cxx11::string::operator=
                    ((string *)local_b8,(string *)(value_4.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(value_4.field_2._M_local_buf + 8));
          value_00 = EnumDescriptor::FindValueByNumber(local_100,(int)local_70);
          goto LAB_00316f5b;
        }
      }
      else {
        TVar2 = (this->tokenizer_).current_.type;
        std::__cxx11::string::~string((string *)&int_value);
        if (TVar2 == TYPE_INTEGER) goto LAB_00316ef8;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &int_value,"Expected integer or identifier, got: ",psVar7);
        ReportError(this,(string *)&int_value);
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&int_value;
LAB_0031717c:
        std::__cxx11::string::~string((string *)this_01);
      }
LAB_00317181:
      bVar3 = true;
      field = (FieldDescriptor *)0x0;
    }
    bVar6 = (byte)field;
    std::__cxx11::string::~string((string *)local_b8);
    if (bVar3) goto LAB_003172a2;
    break;
  case CPPTYPE_STRING:
    int_value = (int64)local_58;
    value = 0;
    local_58[0]._M_local_buf[0] = '\0';
    bVar3 = ConsumeString(this,(string *)&int_value);
    if (!bVar3) goto LAB_00317297;
    if (*(int *)(field + 0x3c) == 3) {
      psVar7 = &local_140;
      std::__cxx11::string::string((string *)psVar7,(string *)&int_value);
      Reflection::AddString(reflection,message,field,psVar7);
    }
    else {
      psVar7 = &local_120;
      std::__cxx11::string::string((string *)psVar7,(string *)&int_value);
      Reflection::SetString(reflection,message,field,psVar7);
    }
    std::__cxx11::string::~string((string *)psVar7);
LAB_00316ecf:
    std::__cxx11::string::~string((string *)&int_value);
    break;
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              ((LogMessage *)&int_value,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/text_format.cc"
               ,0x32c);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&int_value,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)local_b8,other);
    internal::LogMessage::~LogMessage((LogMessage *)&int_value);
  }
  bVar6 = 1;
LAB_003172a2:
  return (bool)(bVar6 & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message, const Reflection* reflection,
                         const FieldDescriptor* field) {
// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                    \
  if (field->is_repeated()) {                        \
    reflection->Add##CPPTYPE(message, field, VALUE); \
  } else {                                           \
    reflection->Set##CPPTYPE(message, field, VALUE); \
  }

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        std::string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          std::string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name() +
                        "\". Value: \"" + value + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        std::string value;
        int64 int_value = kint64max;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = nullptr;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = StrCat(int_value);  // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier, got: " +
                      tokenizer_.current().text);
          return false;
        }

        if (enum_value == nullptr) {
          if (int_value != kint64max &&
              reflection->SupportsUnknownEnumValues()) {
            SET_FIELD(EnumValue, int_value);
            return true;
          } else if (!allow_unknown_enum_) {
            ReportError("Unknown enumeration value of \"" + value +
                        "\" for "
                        "field \"" +
                        field->name() + "\".");
            return false;
          } else {
            ReportWarning("Unknown enumeration value of \"" + value +
                          "\" for "
                          "field \"" +
                          field->name() + "\".");
            return true;
          }
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }